

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall SQCompilation::ValueRef::merge(ValueRef *this,ValueRef *other)

{
  bool bVar1;
  Node *in_RSI;
  ValueRef *in_RDI;
  ValueRefState k;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  ValueRef *this_00;
  
  in_RDI->assigned = (in_RDI->assigned & 1U & in_RSI->field_0x1c & 1) != 0;
  if (in_RDI->lastAssigneeScope == (VarScope *)0x0) {
    in_RDI->lastAssigneeScope = (VarScope *)in_RSI[1].super_ArenaObj._vptr_ArenaObj;
  }
  else if ((in_RSI[1].super_ArenaObj._vptr_ArenaObj != (_func_int **)0x0) &&
          (in_RDI->lastAssigneeScope->depth <
           *(int *)((long)in_RSI[1].super_ArenaObj._vptr_ArenaObj + 4))) {
    in_RDI->lastAssigneeScope = (VarScope *)in_RSI[1].super_ArenaObj._vptr_ArenaObj;
  }
  if (in_RDI->state == (in_RSI->_coordinates).lineStart) {
    this_00 = in_RDI;
    bVar1 = isConstant((ValueRef *)0x1860d3);
    if ((!bVar1) &&
       (bVar1 = NodeEqualChecker::check
                          ((NodeEqualChecker *)this_00,in_RSI,
                           (Node *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)),
       ((bVar1 ^ 0xffU) & 1) != 0)) {
      kill(in_RDI,3,1);
    }
  }
  else {
    kill(in_RDI,*(__pid_t *)
                 (mergeMatrix +
                 (ulong)in_RDI->state * 4 + (ulong)(uint)(in_RSI->_coordinates).lineStart * 0x1c),1)
    ;
  }
  return;
}

Assistant:

void ValueRef::merge(const ValueRef *other) {

  assert(info == other->info);

  assigned &= other->assigned;
  if (lastAssigneeScope) {
    if (other->lastAssigneeScope && other->lastAssigneeScope->depth > lastAssigneeScope->depth)
      lastAssigneeScope = other->lastAssigneeScope;
  }
  else
  {
    lastAssigneeScope = other->lastAssigneeScope;
  }

  if (state != other->state) {
    enum ValueRefState k = mergeMatrix[other->state][state];
    kill(k);
    return;
  }

  if (isConstant()) {
    assert(other->isConstant());
    return;
  }

  if (!NodeEqualChecker().check(expression, other->expression)) {
    kill(VRS_MULTIPLE);
  }
}